

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NscParserRoutines.cpp
# Opt level: O2

CNscPStackEntry * NscBuildLocationConstant(int nLocationType)

{
  CNscPStackEntry *this;
  
  this = CNscContext::GetPStackEntryInt(g_pCtx);
  CNscPStackEntry::SetType(this,NscType_Engine_2);
  CNscPStackEntry::PushConstantLocation(this,nLocationType);
  return this;
}

Assistant:

YYSTYPE NscBuildLocationConstant (int nLocationType)
{
	CNscPStackEntry *pOut = g_pCtx ->GetPStackEntry (__FILE__, __LINE__);
	pOut ->SetType (NscType_Engine_2);
	pOut ->PushConstantLocation(nLocationType);
	return pOut;
}